

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O3

Bac_Man_t * Bac_ManDupUserBoxes(Bac_Man_t *p)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Bac_Man_t *pBVar10;
  size_t sVar11;
  char *pcVar12;
  Abc_Nam_t *pAVar13;
  Bac_Ntk_t *pBVar14;
  int *piVar15;
  char *pcVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  Bac_Ntk_t *pBVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int local_54;
  Bac_Man_t *local_50;
  Vec_Int_t *local_48;
  Bac_Man_t *local_40;
  long local_38;
  
  iVar9 = p->nNtks;
  pBVar10 = (Bac_Man_t *)calloc(1,0x530);
  pcVar16 = p->pName;
  if (pcVar16 == (char *)0x0) {
    pcVar12 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pcVar16);
    pcVar12 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar12,pcVar16);
  }
  pBVar10->pName = pcVar12;
  pcVar16 = p->pSpec;
  if (pcVar16 == (char *)0x0) {
    pcVar12 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pcVar16);
    pcVar12 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar12,pcVar16);
  }
  pBVar10->pSpec = pcVar12;
  pAVar13 = Abc_NamRef(p->pStrs);
  pBVar10->pStrs = pAVar13;
  pAVar13 = Abc_NamStart(1000,0x18);
  pBVar10->pMods = pAVar13;
  pBVar10->iRoot = 1;
  pBVar10->nNtks = iVar9;
  uVar7 = iVar9 + 1;
  pBVar14 = (Bac_Ntk_t *)calloc((long)(int)uVar7,0xd0);
  pBVar10->pNtks = pBVar14;
  auVar5 = _DAT_0093d220;
  auVar4 = _DAT_0093d210;
  if (0 < iVar9) {
    lVar18 = (ulong)uVar7 - 2;
    auVar24._8_4_ = (int)lVar18;
    auVar24._0_8_ = lVar18;
    auVar24._12_4_ = (int)((ulong)lVar18 >> 0x20);
    pBVar14 = pBVar14 + 1;
    uVar19 = 0;
    auVar24 = auVar24 ^ _DAT_0093d220;
    do {
      auVar25._8_4_ = (int)uVar19;
      auVar25._0_8_ = uVar19;
      auVar25._12_4_ = (int)(uVar19 >> 0x20);
      auVar25 = (auVar25 | auVar4) ^ auVar5;
      if ((bool)(~(auVar25._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar25._0_4_ ||
                  auVar24._4_4_ < auVar25._4_4_) & 1)) {
        pBVar14->pDesign = pBVar10;
      }
      if ((auVar25._12_4_ != auVar24._12_4_ || auVar25._8_4_ <= auVar24._8_4_) &&
          auVar25._12_4_ <= auVar24._12_4_) {
        pBVar14[1].pDesign = pBVar10;
      }
      uVar19 = uVar19 + 2;
      pBVar14 = pBVar14 + 2;
    } while ((uVar7 & 0xfffffffe) != uVar19);
  }
  uVar7 = p->nNtks;
  local_50 = pBVar10;
  if (0 < (int)uVar7) {
    piVar15 = &p->pNtks[1].iCopy;
    lVar18 = 1;
    do {
      if (*piVar15 != -1) {
        __assert_fail("p->iCopy == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,0xd8,"void Bac_NtkSetCopy(Bac_Ntk_t *, int)");
      }
      *piVar15 = (int)lVar18;
      lVar18 = lVar18 + 1;
      piVar15 = piVar15 + 0x34;
    } while ((ulong)uVar7 + 1 != lVar18);
    if (0 < (int)uVar7) {
      lVar18 = 1;
      local_40 = p;
      do {
        pBVar14 = local_40->pNtks + lVar18;
        iVar9 = local_40->pNtks[lVar18].iCopy;
        if (((long)iVar9 < 1) || (local_50->nNtks < iVar9)) {
          pBVar20 = (Bac_Ntk_t *)0x0;
        }
        else {
          pBVar20 = local_50->pNtks + iVar9;
          if (pBVar20 == pBVar14) {
            __assert_fail("pNew != p",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                          ,0x242,"void Bac_NtkDupUserBoxes(Bac_Ntk_t *, Bac_Ntk_t *)");
          }
        }
        iVar9 = pBVar14->NameId;
        iVar6 = (pBVar14->vInputs).nSize;
        iVar2 = (pBVar14->vOutputs).nSize;
        iVar22 = (pBVar14->vType).nSize;
        local_38 = lVar18;
        if ((long)iVar22 < 1) {
          iVar21 = 0;
        }
        else {
          lVar18 = 0;
          iVar21 = 0;
          do {
            bVar1 = (pBVar14->vType).pArray[lVar18];
            if ((char)bVar1 < '\0') {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            iVar21 = iVar21 + (uint)((bVar1 & 0x7e) == 6);
            lVar18 = lVar18 + 1;
          } while (iVar22 != lVar18);
        }
        if (pBVar20->pDesign == (Bac_Man_t *)0x0) {
          __assert_fail("pNew->pDesign != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                        ,0x218,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
        }
        if ((pBVar20->vInputs).nSize != 0) {
          __assert_fail("Bac_NtkPiNum(pNew) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                        ,0x219,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
        }
        if ((pBVar20->vOutputs).nSize != 0) {
          __assert_fail("Bac_NtkPoNum(pNew) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                        ,0x21a,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
        }
        pBVar20->NameId = iVar9;
        pBVar20->iCopy = -1;
        pBVar20->iBoxNtk = -1;
        pBVar20->iBoxObj = -1;
        if ((pBVar20->vInputs).nCap < iVar6) {
          piVar15 = (pBVar20->vInputs).pArray;
          if (piVar15 == (int *)0x0) {
            piVar15 = (int *)malloc((long)iVar6 << 2);
          }
          else {
            piVar15 = (int *)realloc(piVar15,(long)iVar6 << 2);
          }
          (pBVar20->vInputs).pArray = piVar15;
          if (piVar15 == (int *)0x0) goto LAB_008ad05a;
          (pBVar20->vInputs).nCap = iVar6;
        }
        if ((pBVar20->vOutputs).nCap < iVar2) {
          piVar15 = (pBVar20->vOutputs).pArray;
          if (piVar15 == (int *)0x0) {
            piVar15 = (int *)malloc((long)iVar2 << 2);
          }
          else {
            piVar15 = (int *)realloc(piVar15,(long)iVar2 << 2);
          }
          (pBVar20->vOutputs).pArray = piVar15;
          if (piVar15 == (int *)0x0) goto LAB_008ad05a;
          (pBVar20->vOutputs).nCap = iVar2;
        }
        iVar22 = (iVar21 + iVar2) * 3 + iVar22;
        if ((pBVar20->vType).nCap < iVar22) {
          pcVar16 = (pBVar20->vType).pArray;
          if (pcVar16 == (char *)0x0) {
            pcVar16 = (char *)malloc((long)iVar22);
          }
          else {
            pcVar16 = (char *)realloc(pcVar16,(long)iVar22);
          }
          (pBVar20->vType).pArray = pcVar16;
          (pBVar20->vType).nCap = iVar22;
        }
        local_48 = &pBVar20->vFanin;
        if ((pBVar20->vFanin).nCap < iVar22) {
          piVar15 = (pBVar20->vFanin).pArray;
          if (piVar15 == (int *)0x0) {
            piVar15 = (int *)malloc((long)iVar22 << 2);
          }
          else {
            piVar15 = (int *)realloc(piVar15,(long)iVar22 << 2);
          }
          (pBVar20->vFanin).pArray = piVar15;
          if (piVar15 == (int *)0x0) goto LAB_008ad05a;
          local_48->nCap = iVar22;
        }
        pAVar13 = pBVar20->pDesign->pMods;
        pcVar16 = Abc_NamStr(pBVar20->pDesign->pStrs,iVar9);
        iVar6 = Abc_NamStrFindOrAdd(pAVar13,pcVar16,&local_54);
        pBVar10 = pBVar20->pDesign;
        if (local_54 == 0) {
          iVar9 = (int)((ulong)((long)pBVar20 - (long)pBVar10->pNtks) >> 4) * -0x3b13b13b;
          if ((iVar9 < 1) || (pBVar10->nNtks < iVar9)) {
            __assert_fail("Bac_ManNtkIsOk(p->pDesign, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                          ,0xd2,"int Bac_NtkId(Bac_Ntk_t *)");
          }
          if (iVar6 != iVar9) {
            __assert_fail("NtkId == Bac_NtkId(pNew)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                          ,0x228,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
          }
        }
        else {
          pcVar16 = Abc_NamStr(pBVar10->pStrs,iVar9);
          printf("Network with name %s already exists.\n",pcVar16);
        }
        iVar9 = (pBVar14->vInfo).nSize;
        if ((iVar9 != 0) && (0 < iVar9)) {
          lVar18 = 0;
          do {
            Vec_IntPush(&pBVar20->vInfo,(pBVar14->vInfo).pArray[lVar18]);
            lVar18 = lVar18 + 1;
          } while (lVar18 < (pBVar14->vInfo).nSize);
        }
        iVar9 = (pBVar14->vType).nCap;
        lVar18 = (long)iVar9;
        if (lVar18 == 0) {
          __assert_fail("Bac_NtkObjNumAlloc(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                        ,0xfe,"void Bac_NtkStartCopies(Bac_Ntk_t *)");
        }
        if ((pBVar14->vCopy).nCap < iVar9) {
          piVar15 = (pBVar14->vCopy).pArray;
          if (piVar15 == (int *)0x0) {
            piVar15 = (int *)malloc(lVar18 * 4);
          }
          else {
            piVar15 = (int *)realloc(piVar15,lVar18 * 4);
          }
          (pBVar14->vCopy).pArray = piVar15;
          if (piVar15 == (int *)0x0) {
LAB_008ad05a:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          (pBVar14->vCopy).nCap = iVar9;
        }
        if (0 < iVar9) {
          memset((pBVar14->vCopy).pArray,0xff,lVar18 << 2);
        }
        (pBVar14->vCopy).nSize = iVar9;
        if (0 < (pBVar14->vInputs).nSize) {
          lVar18 = 0;
          do {
            Bac_ObjDup(pBVar20,pBVar14,(pBVar14->vInputs).pArray[lVar18]);
            lVar18 = lVar18 + 1;
          } while (lVar18 < (pBVar14->vInputs).nSize);
        }
        if (0 < (pBVar14->vOutputs).nSize) {
          lVar18 = 0;
          do {
            Bac_ObjDup(pBVar20,pBVar14,(pBVar14->vOutputs).pArray[lVar18]);
            lVar18 = lVar18 + 1;
          } while (lVar18 < (pBVar14->vOutputs).nSize);
        }
        uVar7 = (pBVar14->vType).nSize;
        if (0 < (int)uVar7) {
          lVar18 = 0;
          do {
            pcVar16 = (pBVar14->vType).pArray;
            if ((pcVar16[lVar18] & 0xfeU) == 10) {
              iVar9 = (int)lVar18;
              lVar17 = lVar18;
              do {
                lVar23 = lVar17;
                if (lVar23 < 1) {
                  uVar8 = 0;
                  goto LAB_008acc46;
                }
                if (uVar7 <= iVar9 - 1U) goto LAB_008acf81;
                lVar17 = lVar23 + -1;
              } while ((pcVar16[lVar23 + -1] & 0xfeU) == 6);
              uVar8 = (uint)lVar23;
LAB_008acc46:
              if ((int)uVar7 <= (int)uVar8) {
LAB_008acf81:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                              ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
              }
              uVar19 = (ulong)uVar8;
              while (((pBVar14->vType).pArray[uVar19] & 0xfeU) == 6) {
                Bac_ObjDup(pBVar20,pBVar14,(int)uVar19);
                uVar19 = uVar19 + 1;
                if ((pBVar14->vType).nSize <= (int)uVar19) goto LAB_008acf81;
              }
              uVar8 = Bac_ObjDup(pBVar20,pBVar14,iVar9);
              if ((((pBVar14->vName).pArray != (int *)0x0) &&
                  ((pBVar20->vName).pArray != (int *)0x0)) &&
                 (iVar6 = Bac_ObjName(pBVar14,iVar9), iVar6 != 0)) {
                iVar9 = Bac_ObjName(pBVar14,iVar9);
                iVar6 = Bac_ObjName(pBVar20,uVar8);
                if (iVar6 != 0) {
LAB_008ad03b:
                  __assert_fail("Bac_ObjName(p, i) == 0 && !Bac_ObjIsCo(p, i)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                                ,300,"void Bac_ObjSetName(Bac_Ntk_t *, int, int)");
                }
                if (((int)uVar8 < 0) || ((pBVar20->vType).nSize <= (int)uVar8)) goto LAB_008acf81;
                if (((pBVar20->vType).pArray[uVar8] & 0xfcU) == 4) goto LAB_008ad03b;
                Vec_IntFillExtra(&pBVar20->vName,uVar8 + 1,0);
                if ((pBVar20->vName).nSize <= (int)uVar8) goto LAB_008ad01c;
                (pBVar20->vName).pArray[uVar8] = iVar9;
              }
              uVar7 = (pBVar14->vType).nSize;
              lVar17 = (long)(int)uVar7;
              if (lVar17 <= lVar18) goto LAB_008acf81;
              if (((byte)(pBVar14->vType).pArray[lVar18] >> 1) - 0x49 < 0xffffffbc) {
                __assert_fail("Bac_ObjIsBox(p, i)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                              ,0x13d,"int Bac_BoxNtkId(Bac_Ntk_t *, int)");
              }
              if ((pBVar14->vFanin).nSize <= lVar18) goto LAB_008acfa0;
              iVar9 = (pBVar14->vFanin).pArray[lVar18];
              if ((0 < (long)iVar9) && (iVar9 <= pBVar14->pDesign->nNtks)) {
                if (((int)uVar8 < 0) || ((pBVar20->vType).nSize <= (int)uVar8)) goto LAB_008acf81;
                iVar9 = pBVar14->pDesign->pNtks[iVar9].iCopy;
                if (((iVar9 < 1) || (0x43 < ((byte)(pBVar20->vType).pArray[uVar8] >> 1) - 5)) ||
                   (pBVar20->pDesign->nNtks < iVar9)) {
                  __assert_fail("Bac_ObjIsBox(p, i)&&Bac_ManNtkIsOk(p->pDesign, x)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                                ,0x13e,"void Bac_BoxSetNtkId(Bac_Ntk_t *, int, int)");
                }
                Vec_IntFillExtra(local_48,uVar8 + 1,0);
                if ((pBVar20->vFanin).nSize <= (int)uVar8) {
LAB_008ad01c:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                }
                (pBVar20->vFanin).pArray[uVar8] = iVar9;
                uVar7 = (pBVar14->vType).nSize;
                lVar17 = (long)(int)uVar7;
              }
              lVar23 = lVar18;
              if (lVar18 + 1 < lVar17) {
                do {
                  iVar9 = (int)lVar23;
                  if (iVar9 < -1) goto LAB_008acf81;
                  if (((pBVar14->vType).pArray[lVar23 + 1] & 0xfeU) != 8) break;
                  Bac_ObjDup(pBVar20,pBVar14,iVar9 + 1);
                  uVar7 = (pBVar14->vType).nSize;
                  lVar23 = lVar23 + 1;
                } while (iVar9 + 2 < (int)uVar7);
              }
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < (int)uVar7);
          if (0 < (int)uVar7) {
            lVar18 = 0;
            do {
              if (((pBVar14->vType).pArray[lVar18] & 0xfcU) == 4) {
                uVar8 = (pBVar14->vCopy).nSize;
                if ((int)uVar8 <= lVar18) goto LAB_008acfa0;
                piVar15 = (pBVar14->vCopy).pArray;
                iVar9 = piVar15[lVar18];
                if (-1 < iVar9) {
                  if ((pBVar14->vFanin).nSize <= lVar18) goto LAB_008acfa0;
                  uVar3 = (pBVar14->vFanin).pArray[lVar18];
                  if (((long)(int)uVar3 < 0) || (uVar8 <= uVar3)) goto LAB_008acfa0;
                  iVar6 = piVar15[(int)uVar3];
                  if (-1 < iVar6) {
                    Bac_ObjSetFanin(pBVar20,iVar9,iVar6);
                    uVar7 = (pBVar14->vType).nSize;
                  }
                }
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < (int)uVar7);
          }
        }
        lVar18 = local_38 + 1;
        uVar7 = local_40->nNtks;
      } while (local_38 < (int)uVar7);
      if (0 < (int)uVar7) {
        pBVar14 = local_40->pNtks;
        lVar18 = 0;
        do {
          iVar9 = *(int *)((long)&pBVar14[1].iBoxNtk + lVar18);
          if ((0 < (long)iVar9) &&
             (lVar17 = *(long *)((long)&pBVar14[1].pDesign + lVar18),
             iVar9 <= *(int *)(lVar17 + 0x24))) {
            iVar6 = *(int *)((long)&pBVar14[1].iCopy + lVar18);
            if (((long)iVar6 < 1) || (local_50->nNtks < iVar6)) {
              pBVar20 = (Bac_Ntk_t *)0x0;
            }
            else {
              pBVar20 = local_50->pNtks + iVar6;
            }
            iVar6 = *(int *)((long)&pBVar14[1].iBoxObj + lVar18);
            if (((long)iVar6 < 0) ||
               (lVar17 = (long)iVar9 * 0xd0 + *(long *)(lVar17 + 0x28),
               *(int *)(lVar17 + 0xa4) <= iVar6)) {
LAB_008acfa0:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (pBVar20->iBoxNtk != -1) {
              __assert_fail("p->iBoxNtk == -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                            ,0xee,"void Bac_NtkSetHost(Bac_Ntk_t *, int, int)");
            }
            iVar9 = *(int *)(*(long *)(lVar17 + 0xa8) + (long)iVar6 * 4);
            pBVar20->iBoxNtk = *(int *)(lVar17 + 0xc);
            pBVar20->iBoxObj = iVar9;
          }
          lVar18 = lVar18 + 0xd0;
        } while ((ulong)uVar7 * 0xd0 - lVar18 != 0);
      }
    }
  }
  return local_50;
}

Assistant:

static inline Bac_Man_t * Bac_ManDupUserBoxes( Bac_Man_t * p )
{
    Bac_Ntk_t * pNtk, * pHost; int i;
    Bac_Man_t * pNew = Bac_ManStart( p, Bac_ManNtkNum(p) );
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_NtkSetCopy( pNtk, i );
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_NtkDupUserBoxes( Bac_NtkCopyNtk(pNew, pNtk), pNtk );
    Bac_ManForEachNtk( p, pNtk, i )
        if ( (pHost = Bac_NtkHostNtk(pNtk)) )
            Bac_NtkSetHost( Bac_NtkCopyNtk(pNew, pNtk), Bac_NtkCopy(pHost), Bac_ObjCopy(pHost, Bac_NtkHostObj(pNtk)) );
    return pNew;
}